

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
DSBarInfo::DrawString
          (DSBarInfo *this,FFont *font,char *cstring,SBarInfoCoordinate x,SBarInfoCoordinate y,
          int xOffset,int yOffset,double Alpha,bool fullScreenOffsets,EColorRange translation,
          int spacing,bool drawshadow,int shadowX,int shadowY)

{
  MonospaceAlignment MVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  double *in_stack_fffffffffffffee8;
  undefined4 uVar7;
  ulong uVar6;
  BYTE **in_stack_fffffffffffffef0;
  int local_fc;
  int local_ec;
  double sry;
  double srx;
  double salpha;
  bool ybot;
  bool xright;
  double spacingSize;
  double rh;
  double rw;
  double ry;
  double rx;
  FTexture *character;
  int width;
  EColorRange newColor;
  double local_80;
  FRemapTable *local_78;
  FRemapTable *remap;
  BYTE *pBStack_68;
  EColorRange boldTranslation;
  BYTE *str;
  double yScale;
  double xScale;
  double ay;
  double ax;
  bool drawshadow_local;
  double dStack_38;
  bool fullScreenOffsets_local;
  double Alpha_local;
  BYTE *pBStack_28;
  int xOffset_local;
  char *cstring_local;
  FFont *font_local;
  DSBarInfo *this_local;
  SBarInfoCoordinate y_local;
  SBarInfoCoordinate x_local;
  
  ax._7_1_ = fullScreenOffsets;
  ax._6_1_ = drawshadow;
  dStack_38 = Alpha;
  Alpha_local._4_4_ = xOffset;
  pBStack_28 = (BYTE *)cstring;
  cstring_local = (char *)font;
  font_local = (FFont *)this;
  this_local._0_4_ = y;
  this_local._4_4_ = x;
  SBarInfoCoordinate::operator+=((SBarInfoCoordinate *)((long)&this_local + 4),spacing);
  iVar5 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)((long)&this_local + 4));
  ay = (double)iVar5;
  iVar5 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)&this_local);
  xScale = (double)iVar5;
  yScale = 1.0;
  str = (BYTE *)0x3ff0000000000000;
  pBStack_68 = pBStack_28;
  if (translation == CR_BRICK) {
    local_ec = NumTextColors + -1;
  }
  else {
    local_ec = translation + CR_UNDEFINED;
  }
  remap._4_4_ = local_ec;
  local_78 = FFont::GetColorTranslation((FFont *)cstring_local,translation);
  if ((ax._7_1_ & 1) != 0) {
    bVar2 = FBoolCVar::operator_cast_to_bool(&hud_scale);
    if (bVar2) {
      yScale = (double)this->script->cleanX;
      str = (BYTE *)(double)this->script->cleanY;
    }
    bVar2 = SBarInfoCoordinate::RelCenter((SBarInfoCoordinate *)((long)&this_local + 4));
    bVar3 = SBarInfoCoordinate::RelCenter((SBarInfoCoordinate *)&this_local);
    iVar5 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)((long)&this_local + 4));
    local_80 = (double)iVar5;
    iVar5 = SBarInfoCoordinate::operator*((SBarInfoCoordinate *)&this_local);
    _width = (double)iVar5;
    in_stack_fffffffffffffef0 = &str;
    in_stack_fffffffffffffee8 = &yScale;
    adjustRelCenter(bVar2,bVar3,&local_80,(double *)&width,&ay,&xScale,in_stack_fffffffffffffee8,
                    (double *)in_stack_fffffffffffffef0);
  }
  while (*pBStack_68 != '\0') {
    if (*pBStack_68 == ' ') {
      if (this->script->spacingCharacter == '\0') {
        iVar5 = FFont::GetSpaceWidth((FFont *)cstring_local);
        ay = (double)iVar5 + ay;
      }
      else {
        iVar5 = (**(code **)(*(long *)cstring_local + 0x18))
                          (cstring_local,this->script->spacingCharacter);
        ay = (double)iVar5 + ay;
      }
      pBStack_68 = pBStack_68 + 1;
    }
    else if (*pBStack_68 == '\x1c') {
      pBStack_68 = pBStack_68 + 1;
      character._4_4_ = V_ParseFontColor(&stack0xffffffffffffff98,translation,remap._4_4_);
      if (character._4_4_ != CR_UNDEFINED) {
        local_78 = FFont::GetColorTranslation((FFont *)cstring_local,character._4_4_);
      }
    }
    else {
      if (this->script->spacingCharacter == '\0') {
        character._0_4_ = (**(code **)(*(long *)cstring_local + 0x18))(cstring_local,*pBStack_68);
      }
      else {
        character._0_4_ =
             (**(code **)(*(long *)cstring_local + 0x18))
                       (cstring_local,this->script->spacingCharacter);
      }
      rx = (double)(**(code **)(*(long *)cstring_local + 0x10))
                             (cstring_local,*pBStack_68,&character);
      if ((FTexture *)rx == (FTexture *)0x0) {
        pBStack_68 = pBStack_68 + 1;
      }
      else {
        if (this->script->spacingCharacter == '\0') {
          ay = (double)(((FTexture *)rx)->LeftOffset + 1) + ay;
        }
        ry = ay + (double)Alpha_local._4_4_;
        rw = xScale + (double)yOffset;
        rh = FTexture::GetScaledWidthDouble((FTexture *)rx);
        spacingSize = FTexture::GetScaledHeightDouble((FTexture *)rx);
        if (this->script->spacingCharacter != '\0') {
          iVar5 = (**(code **)(*(long *)cstring_local + 0x18))
                            (cstring_local,this->script->spacingCharacter);
          MVar1 = this->script->spacingAlignment;
          if (MVar1 == ALIGN_CENTER) {
            ry = ((double)iVar5 / 2.0 - rh / 2.0) + ry;
          }
          else if (MVar1 == ALIGN_RIGHT) {
            ry = ((double)iVar5 - rh) + ry;
          }
        }
        if ((ax._7_1_ & 1) == 0) {
          ry = (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24 + ry;
          if (((this->super_DBaseStatusBar).Scaled & 1U) == 0) {
            local_fc = 200;
          }
          else {
            local_fc = this->script->resH;
          }
          rw = (double)(((this->super_DBaseStatusBar).ST_Y - local_fc) + this->script->height) + rw;
          if (((this->super_DBaseStatusBar).Scaled & 1U) == 0) {
            rw = (double)(200 - this->script->resH) + rw;
          }
          else {
            in_stack_fffffffffffffee8 =
                 (double *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),1);
            DCanvas::VirtualToRealCoords
                      ((DCanvas *)screen,&ry,&rw,&rh,&spacingSize,(double)this->script->resW,
                       (double)this->script->resH,true,true);
          }
        }
        else {
          bVar2 = FBoolCVar::operator_cast_to_bool(&vid_fps);
          if (((bVar2) && (ay < 0.0)) && (0.0 <= xScale)) {
            rw = rw + 10.0;
          }
          bVar2 = ry < 0.0;
          bVar3 = rw < 0.0;
          bVar4 = FBoolCVar::operator_cast_to_bool(&hud_scale);
          if (bVar4) {
            ry = yScale * ry;
            rw = (double)str * rw;
            rh = yScale * rh;
            spacingSize = (double)str * spacingSize;
          }
          if (bVar2) {
            iVar5 = DCanvas::GetWidth((DCanvas *)screen);
            ry = (double)iVar5 + ry;
          }
          if (bVar3) {
            iVar5 = DCanvas::GetHeight((DCanvas *)screen);
            rw = (double)iVar5 + rw;
          }
        }
        uVar7 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        if ((ax._6_1_ & 1) != 0) {
          uVar6 = (ulong)in_stack_fffffffffffffee8 & 0xffffffff00000000;
          in_stack_fffffffffffffef0 =
               (BYTE **)((ulong)in_stack_fffffffffffffef0 & 0xffffffff00000000);
          DCanvas::DrawTexture
                    ((DCanvas *)screen,(FTexture *)rx,ry + (double)shadowX * yScale,
                     rw + (double)shadowY * (double)str,0x400013af,rh,spacingSize,
                     dStack_38 * 0.40625,0x400013b0,0x4000138c,0x4000138d,uVar6,
                     in_stack_fffffffffffffef0);
          uVar7 = (undefined4)(uVar6 >> 0x20);
        }
        in_stack_fffffffffffffee8 = (double *)CONCAT44(uVar7,0x4000138c);
        in_stack_fffffffffffffef0 = (BYTE **)((ulong)in_stack_fffffffffffffef0 & 0xffffffff00000000)
        ;
        DCanvas::DrawTexture
                  ((DCanvas *)screen,(FTexture *)rx,ry,rw,0x400013af,rh,spacingSize,dStack_38,
                   0x400013b0,0x4000138e,local_78,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffef0);
        if (this->script->spacingCharacter == '\0') {
          ay = (double)(((int)character + spacing) - (*(short *)((long)rx + 8) + 1)) + ay;
        }
        else {
          iVar5 = (**(code **)(*(long *)cstring_local + 0x18))
                            (cstring_local,this->script->spacingCharacter);
          ay = (double)(iVar5 + spacing) + ay;
        }
        pBStack_68 = pBStack_68 + 1;
      }
    }
  }
  return;
}

Assistant:

void DrawString(FFont *font, const char* cstring, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, EColorRange translation, int spacing=0, bool drawshadow=false, int shadowX=2, int shadowY=2) const
	{
		x += spacing;
		double ax = *x;
		double ay = *y;

		double xScale = 1.0;
		double yScale = 1.0;

		const BYTE* str = (const BYTE*) cstring;
		const EColorRange boldTranslation = EColorRange(translation ? translation - 1 : NumTextColors - 1);
		FRemapTable *remap = font->GetColorTranslation(translation);

		if(fullScreenOffsets)
		{
			if(hud_scale)
			{
				xScale = script->cleanX;
				yScale = script->cleanY;
			}
			adjustRelCenter(x.RelCenter(), y.RelCenter(), *x, *y, ax, ay, xScale, yScale);
		}
		while(*str != '\0')
		{
			if(*str == ' ')
			{
				if(script->spacingCharacter == '\0')
					ax += font->GetSpaceWidth();
				else
					ax += font->GetCharWidth((unsigned char) script->spacingCharacter);
				str++;
				continue;
			}
			else if(*str == TEXTCOLOR_ESCAPE)
			{
				EColorRange newColor = V_ParseFontColor(++str, translation, boldTranslation);
				if(newColor != CR_UNDEFINED)
					remap = font->GetColorTranslation(newColor);
				continue;
			}

			int width;
			if(script->spacingCharacter == '\0') //No monospace?
				width = font->GetCharWidth((unsigned char) *str);
			else
				width = font->GetCharWidth((unsigned char) script->spacingCharacter);
			FTexture* character = font->GetChar((unsigned char) *str, &width);
			if(character == NULL) //missing character.
			{
				str++;
				continue;
			}
			if(script->spacingCharacter == '\0') //If we are monospaced lets use the offset
				ax += (character->LeftOffset+1); //ignore x offsets since we adapt to character size

			double rx, ry, rw, rh;
			rx = ax + xOffset;
			ry = ay + yOffset;
			rw = character->GetScaledWidthDouble();
			rh = character->GetScaledHeightDouble();

			if(script->spacingCharacter != '\0')
			{
				double spacingSize = font->GetCharWidth((unsigned char) script->spacingCharacter);
				switch(script->spacingAlignment)
				{
					default:
						break;
					case SBarInfo::ALIGN_CENTER:
						rx += (spacingSize/2)-(rw/2);
						break;
					case SBarInfo::ALIGN_RIGHT:
						rx += spacingSize-rw;
						break;
				}
			}

			if(!fullScreenOffsets)
			{
				rx += ST_X;
				ry += ST_Y - (Scaled ? script->resH : 200) + script->height;
				if(Scaled)
					screen->VirtualToRealCoords(rx, ry, rw, rh, script->resW, script->resH, true);
				else
				{
					ry += (200 - script->resH);
				}
			}
			else
			{
				if(vid_fps && ax < 0 && ay >= 0)
					ry += 10;

				bool xright = rx < 0;
				bool ybot = ry < 0;

				if(hud_scale)
				{
					rx *= xScale;
					ry *= yScale;
					rw *= xScale;
					rh *= yScale;
				}
				if(xright)
					rx = SCREENWIDTH + rx;
				if(ybot)
					ry = SCREENHEIGHT + ry;
			}
			if(drawshadow)
			{
				double salpha = (Alpha *HR_SHADOW);
				double srx = rx + (shadowX*xScale);
				double sry = ry + (shadowY*yScale);
				screen->DrawTexture(character, srx, sry,
					DTA_DestWidthF, rw,
					DTA_DestHeightF, rh,
					DTA_AlphaF, salpha,
					DTA_FillColor, 0,
					TAG_DONE);
			}
			screen->DrawTexture(character, rx, ry,
				DTA_DestWidthF, rw,
				DTA_DestHeightF, rh,
				DTA_Translation, remap,
				DTA_AlphaF, Alpha,
				TAG_DONE);
			if(script->spacingCharacter == '\0')
				ax += width + spacing - (character->LeftOffset+1);
			else //width gets changed at the call to GetChar()
				ax += font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing;
			str++;
		}
	}